

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DataDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DataDeclarationSyntax,slang::syntax::DataDeclarationSyntax_const&>
          (BumpAllocator *this,DataDeclarationSyntax *args)

{
  DataDeclarationSyntax *pDVar1;
  DataDeclarationSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pDVar1 = (DataDeclarationSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::DataDeclarationSyntax::DataDeclarationSyntax(in_RSI,pDVar1);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }